

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::keyboardSearch(QTreeView *this,QString *search)

{
  QAbstractItemModel *pQVar1;
  byte bVar2;
  bool bVar3;
  QChar QVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  QTreeViewPrivate *pQVar8;
  const_reference pQVar9;
  qsizetype qVar10;
  long lVar11;
  int *piVar12;
  QString *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar13;
  int i;
  int previousLevel;
  int startIndex;
  int origCol;
  int c;
  bool sameKey;
  qint64 keyboardInputTimeElapsed;
  bool keyboardTimeWasValid;
  bool skipRow;
  QTreeViewPrivate *d;
  QModelIndex index;
  int hitIndex;
  QModelIndexList match;
  QModelIndex searchFrom;
  QString searchString;
  int bestBelow;
  int bestAbove;
  QModelIndex start;
  QFlagsStorage<Qt::MatchFlag> in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  enum_type in_stack_fffffffffffffd70;
  enum_type in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  QTreeViewPrivate *in_stack_fffffffffffffd80;
  QModelIndex *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  QModelIndex *in_stack_fffffffffffffdc8;
  int local_218;
  uint local_210;
  undefined1 *local_1f8;
  bool local_1e9;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  QAbstractItemModel *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1a8;
  int local_19c;
  QList<QModelIndex> local_198 [3];
  undefined1 *local_150;
  quintptr local_148;
  QAbstractItemModel *local_140;
  QModelIndex local_138;
  QString local_120;
  int local_108;
  int local_104;
  undefined1 *local_100;
  quintptr local_f8;
  QAbstractItemModel *local_f0;
  undefined1 *local_e8;
  quintptr local_e0;
  QAbstractItemModel *local_d8;
  undefined1 *local_a0;
  quintptr local_98;
  QAbstractItemModel *local_90;
  undefined1 *local_70;
  undefined1 *local_68;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_60;
  QPersistentModelIndex local_58 [3];
  QPersistentModelIndex local_40 [3];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QTreeView *)0x8f250e);
  pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
  iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_40);
  bVar13 = true;
  if (iVar5 != 0) {
    in_stack_fffffffffffffdc8 = (QModelIndex *)(pQVar8->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
    iVar5 = (**(code **)(*(long *)in_stack_fffffffffffffdc8 + 0x80))
                      (in_stack_fffffffffffffdc8,local_58);
    bVar13 = iVar5 == 0;
  }
  if (!bVar13) {
    QAbstractItemViewPrivate::executePostedLayout
              ((QAbstractItemViewPrivate *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    bVar13 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8f25e8);
    if (!bVar13) {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x8f262d);
      QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffd80);
      bVar13 = QModelIndex::isValid
                         ((QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      if (bVar13) {
        QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffd80);
        local_70 = local_a0;
        local_68 = (undefined1 *)local_98;
        local_60.ptr = local_90;
      }
      else {
        pQVar9 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
        local_70._0_4_ = (pQVar9->index).r;
        local_70._4_4_ = (pQVar9->index).c;
        local_68 = (undefined1 *)(pQVar9->index).i;
        local_60.ptr = (pQVar9->index).m.ptr;
      }
      local_1e9 = false;
      bVar2 = QElapsedTimer::isValid();
      local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
      if ((bVar2 & 1) == 0) {
        QElapsedTimer::start();
      }
      else {
        local_1f8 = (undefined1 *)QElapsedTimer::restart();
      }
      bVar13 = QString::isEmpty((QString *)0x8f2751);
      if (((bVar13) || ((bVar2 & 1) == 0)) ||
         (iVar5 = QApplication::keyboardInputInterval(), (long)iVar5 < (long)local_1f8)) {
        QString::operator=(&(pQVar8->super_QAbstractItemViewPrivate).keyboardInput,in_RSI);
        QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffd80);
        local_1e9 = QModelIndex::isValid
                              ((QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
      else {
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                            ,(QString *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
      }
      bVar13 = false;
      qVar10 = QString::size(&(pQVar8->super_QAbstractItemViewPrivate).keyboardInput);
      if (1 < qVar10) {
        QString::size(&(pQVar8->super_QAbstractItemViewPrivate).keyboardInput);
        QVar4 = QString::at((QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                            ,CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        iVar5 = QString::count((QChar *)&(pQVar8->super_QAbstractItemViewPrivate).keyboardInput,
                               (uint)(ushort)QVar4.ucs);
        qVar10 = QString::size(&(pQVar8->super_QAbstractItemViewPrivate).keyboardInput);
        bVar13 = iVar5 == qVar10;
        if (bVar13) {
          local_1e9 = true;
        }
      }
      if (local_1e9 != false) {
        indexBelow((QTreeView *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd98);
        bVar3 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        if (bVar3) {
          indexBelow((QTreeView *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
          local_70 = local_e8;
          local_68 = (undefined1 *)local_e0;
          local_60.ptr = local_d8;
        }
        else {
          iVar5 = QModelIndex::column((QModelIndex *)&local_70);
          pQVar9 = QList<QTreeViewItem>::at
                             ((QList<QTreeViewItem> *)
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
          local_70._0_4_ = (pQVar9->index).r;
          local_70._4_4_ = (pQVar9->index).c;
          local_68 = (undefined1 *)(pQVar9->index).i;
          local_60.ptr = (pQVar9->index).m.ptr;
          iVar6 = QModelIndex::column((QModelIndex *)&local_70);
          if (iVar5 != iVar6) {
            QModelIndex::row((QModelIndex *)&local_70);
            QModelIndex::sibling
                      ((QModelIndex *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                       in_stack_fffffffffffffd78);
            local_70 = local_100;
            local_68 = (undefined1 *)local_f8;
            local_60.ptr = local_f0;
          }
        }
      }
      uVar7 = QTreeViewPrivate::viewIndex(in_RDI,in_stack_fffffffffffffdc8);
      if (uVar7 < 0x80000000) {
        local_210 = 0xffffffff;
        local_104 = -1;
        local_108 = -1;
        local_120.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_120.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_120.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        if (bVar13) {
          QVar4 = QString::at((QString *)
                              CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          QString::QString(&local_120,(QChar *)(ulong)(ushort)QVar4.ucs);
        }
        else {
          QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
        }
        local_218 = 0;
        while( true ) {
          lVar11 = (long)local_218;
          qVar10 = QList<QTreeViewItem>::size(&pQVar8->viewItems);
          if (qVar10 <= lVar11) break;
          pQVar9 = QList<QTreeViewItem>::at
                             ((QList<QTreeViewItem> *)
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
          if ((int)local_210 <
              (int)((uint)((ulong)*(undefined8 *)&pQVar9->field_0x1c >> 0x20) & 0xffff)) {
            local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_138.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            local_138.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar9 = QList<QTreeViewItem>::at
                               ((QList<QTreeViewItem> *)
                                CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
            local_138.r = (pQVar9->index).r;
            local_138.c = (pQVar9->index).c;
            local_138.i = (pQVar9->index).i;
            local_138.m.ptr = (pQVar9->index).m.ptr;
            iVar5 = QModelIndex::column((QModelIndex *)&local_70);
            if (0 < iVar5) {
              QModelIndex::row(&local_138);
              QModelIndex::column((QModelIndex *)&local_70);
              QModelIndex::sibling
                        ((QModelIndex *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                         in_stack_fffffffffffffd78);
              local_138._0_8_ = local_150;
              local_138.i = local_148;
              local_138.m.ptr = local_140;
            }
            QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffd80);
            QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffd80);
            bVar13 = ::operator==((QModelIndex *)
                                  CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                  (QModelIndex *)
                                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
            if (bVar13) {
              local_138._0_8_ = local_70;
              local_138.i = (quintptr)local_68;
              local_138.m.ptr = local_60.ptr;
            }
            local_198[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_198[0].d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
            local_198[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
            ::QVariant::QVariant(&local_28,(QString *)&local_120);
            in_stack_fffffffffffffd68.i =
                 (Int)Qt::operator|(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70);
            (**(code **)(*(long *)pQVar1 + 0x150))(local_198,pQVar1,&local_138,0,&local_28,1);
            ::QVariant::~QVariant(&local_28);
            qVar10 = QList<QModelIndex>::size(local_198);
            iVar5 = local_108;
            iVar6 = local_104;
            if (qVar10 != 0) {
              in_stack_fffffffffffffd80 = pQVar8;
              QList<QModelIndex>::at
                        ((QList<QModelIndex> *)
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
              local_19c = QTreeViewPrivate::viewIndex(in_RDI,in_stack_fffffffffffffdc8);
              iVar5 = local_108;
              if ((local_19c < 0) || ((int)uVar7 <= local_19c)) {
                iVar6 = local_104;
                if (((int)uVar7 <= local_19c) &&
                   (in_stack_fffffffffffffd78 = local_19c, iVar5 = local_19c, local_108 != -1)) {
                  piVar12 = qMin<int>(&local_19c,&local_108);
                  in_stack_fffffffffffffd78 = *piVar12;
                  iVar5 = *piVar12;
                  iVar6 = local_104;
                }
              }
              else {
                in_stack_fffffffffffffd7c = local_19c;
                iVar6 = local_19c;
                if (local_104 != -1) {
                  piVar12 = qMin<int>(&local_19c,&local_104);
                  in_stack_fffffffffffffd7c = *piVar12;
                  iVar5 = local_108;
                  iVar6 = *piVar12;
                }
              }
            }
            local_104 = iVar6;
            local_108 = iVar5;
            QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8f2e72);
          }
          pQVar9 = QList<QTreeViewItem>::at
                             ((QList<QTreeViewItem> *)
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
          local_210 = (uint)((ulong)*(undefined8 *)&pQVar9->field_0x1c >> 0x20) & 0xffff;
          local_218 = local_218 + 1;
        }
        local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::QModelIndex((QModelIndex *)0x8f2ef3);
        if (local_108 < 0) {
          if (-1 < local_104) {
            pQVar9 = QList<QTreeViewItem>::at
                               ((QList<QTreeViewItem> *)
                                CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
            local_1b8 = *(undefined1 **)&pQVar9->index;
            local_1b0 = (undefined1 *)(pQVar9->index).i;
            local_1a8.ptr = (pQVar9->index).m.ptr;
          }
        }
        else {
          pQVar9 = QList<QTreeViewItem>::at
                             ((QList<QTreeViewItem> *)
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.i));
          local_1b8 = *(undefined1 **)&pQVar9->index;
          local_1b0 = (undefined1 *)(pQVar9->index).i;
          local_1a8.ptr = (pQVar9->index).m.ptr;
        }
        iVar5 = QModelIndex::column((QModelIndex *)&local_70);
        if (0 < iVar5) {
          in_stack_fffffffffffffd74 = QModelIndex::row((QModelIndex *)&local_1b8);
          QModelIndex::column((QModelIndex *)&local_70);
          QModelIndex::sibling
                    ((QModelIndex *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                     in_stack_fffffffffffffd78);
          local_1b8 = local_1d0;
          local_1b0 = local_1c8;
          local_1a8.ptr = local_1c0;
        }
        bVar13 = QModelIndex::isValid
                           ((QModelIndex *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        if (bVar13) {
          QAbstractItemView::setCurrentIndex
                    ((QAbstractItemView *)in_stack_fffffffffffffd80,
                     (QModelIndex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        }
        QString::~QString((QString *)0x8f3036);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::keyboardSearch(const QString &search)
{
    Q_D(QTreeView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    // Do a relayout nows, so that we can utilize viewItems
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return;

    QModelIndex start;
    if (currentIndex().isValid())
        start = currentIndex();
    else
        start = d->viewItems.at(0).index;

    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        if (indexBelow(start).isValid()) {
            start = indexBelow(start);
        } else {
            const int origCol = start.column();
            start = d->viewItems.at(0).index;
            if (origCol != start.column())
                start = start.sibling(start.row(), origCol);
        }
    }

    int startIndex = d->viewIndex(start);
    if (startIndex <= -1)
        return;

    int previousLevel = -1;
    int bestAbove = -1;
    int bestBelow = -1;
    QString searchString = sameKey ? QString(d->keyboardInput.at(0)) : d->keyboardInput;
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if ((int)d->viewItems.at(i).level > previousLevel) {
            QModelIndex searchFrom = d->viewItems.at(i).index;
            if (start.column() > 0)
                searchFrom = searchFrom.sibling(searchFrom.row(), start.column());
            if (searchFrom.parent() == start.parent())
                searchFrom = start;
            QModelIndexList match = d->model->match(searchFrom, Qt::DisplayRole, searchString);
            if (match.size()) {
                int hitIndex = d->viewIndex(match.at(0));
                if (hitIndex >= 0 && hitIndex < startIndex)
                    bestAbove = bestAbove == -1 ? hitIndex : qMin(hitIndex, bestAbove);
                else if (hitIndex >= startIndex)
                    bestBelow = bestBelow == -1 ? hitIndex : qMin(hitIndex, bestBelow);
            }
        }
        previousLevel = d->viewItems.at(i).level;
    }

    QModelIndex index;
    if (bestBelow > -1)
        index = d->viewItems.at(bestBelow).index;
    else if (bestAbove > -1)
        index = d->viewItems.at(bestAbove).index;

    if (start.column() > 0)
        index = index.sibling(index.row(), start.column());

    if (index.isValid())
        setCurrentIndex(index);
}